

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall
QMessageBox::QMessageBox
          (QMessageBox *this,QString *title,QString *text,Icon icon,int button0,int button1,
          int button2,QWidget *parent,WindowFlags f)

{
  QMessageBoxPrivate *this_00;
  QDialogPrivate *this_01;
  
  this_01 = (QDialogPrivate *)operator_new(0x3b0);
  QDialogPrivate::QDialogPrivate(this_01);
  *(undefined ***)&this_01->super_QWidgetPrivate = &PTR__QMessageBoxPrivate_00812a90;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x28 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x30 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x38 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x40 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x48 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x50 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x58 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x59 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x61 = 0;
  this_01[1].super_QWidgetPrivate.field_0x69 = 1;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x70 = 0;
  this_01[1].super_QWidgetPrivate.extra._M_t.
  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = (QWExtra *)0x0;
  this_01[1].super_QWidgetPrivate.focus_next = (QWidget *)0x0;
  this_01[1].super_QWidgetPrivate.focus_prev = (QWidget *)0x0;
  this_01[1].super_QWidgetPrivate.focus_child = (QWidget *)0x0;
  this_01[1].super_QWidgetPrivate.layout = (QLayout *)0x0;
  this_01[1].super_QWidgetPrivate.needsFlush = (QRegion *)0x0;
  this_01[1].super_QWidgetPrivate.redirectDev = (QPaintDevice *)0x0;
  this_01[1].super_QWidgetPrivate.widgetItem = (QWidgetItemV2 *)0x0;
  this_01[1].super_QWidgetPrivate.extraPaintEngine = (QPaintEngine *)0x0;
  QMessageDialogOptions::create();
  QDialog::QDialog(&this->super_QDialog,this_01,parent,
                   (WindowFlags)
                   ((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i | 0x8003000));
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_00812540;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QMessageBox_00812718;
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QMessageBoxPrivate::init(this_00,(EVP_PKEY_CTX *)title);
  setIcon(this,icon);
  QMessageBoxPrivate::addOldButtons(this_00,button0,button1,button2);
  return;
}

Assistant:

QMessageBox::QMessageBox(const QString &title, const QString &text, Icon icon,
                         int button0, int button1, int button2, QWidget *parent,
                         Qt::WindowFlags f)
    : QDialog(*new QMessageBoxPrivate, parent,
              f /*| Qt::MSWindowsFixedSizeDialogHint #### */| Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint)
{
    Q_D(QMessageBox);
    d->init(title, text);
    setIcon(icon);
    d->addOldButtons(button0, button1, button2);
}